

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O3

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,
          uint32_t startX2,uint32_t startY2,uint32_t width,uint32_t height)

{
  InputImageInfo *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  InputImageInfo *pIVar4;
  imageException *this_00;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,width,height);
  bVar2 = AbstractTaskProvider::_ready((AbstractTaskProvider *)this);
  if (!bVar2) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"FunctionTask object was called multiple times!");
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
  pIVar4 = (InputImageInfo *)operator_new(0x68);
  uVar3 = anon_unknown.dwarf_52a2f::threadCount();
  AreaInfo::AreaInfo((AreaInfo *)pIVar4,startX1,startY1,width,height,uVar3);
  pIVar4->image = in1;
  pIVar1 = (this->_infoIn1)._M_t.
           super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
           .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
  (this->_infoIn1)._M_t.
  super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
  .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl = pIVar4;
  if (pIVar1 != (InputImageInfo *)0x0) {
    std::default_delete<Function_Pool::InputImageInfo>::operator()
              ((default_delete<Function_Pool::InputImageInfo> *)&this->_infoIn1,pIVar1);
  }
  pIVar4 = (InputImageInfo *)operator_new(0x68);
  uVar3 = anon_unknown.dwarf_52a2f::threadCount();
  AreaInfo::AreaInfo((AreaInfo *)pIVar4,startX2,startY2,width,height,uVar3);
  pIVar4->image = in2;
  pIVar1 = (this->_infoIn2)._M_t.
           super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
           .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
  (this->_infoIn2)._M_t.
  super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
  .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl = pIVar4;
  if (pIVar1 != (InputImageInfo *)0x0) {
    std::default_delete<Function_Pool::InputImageInfo>::operator()
              ((default_delete<Function_Pool::InputImageInfo> *)&this->_infoIn2,pIVar1);
    return;
  }
  return;
}

Assistant:

void FunctionPoolTask::_setup( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                 uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, width, height );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in1, startX1, startY1, width, height, threadCount() ) );
        _infoIn2 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in2, startX2, startY2, width, height, threadCount() ) );
    }